

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entity.cpp
# Opt level: O2

string * __thiscall Entity::getName_abi_cxx11_(string *__return_storage_ptr__,Entity *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->name);
  return __return_storage_ptr__;
}

Assistant:

string Entity::getName(){
    return name;
}